

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# timerset.c
# Opt level: O2

int nn_timerset_event(nn_timerset *self,nn_timerset_hndl **hndl)

{
  ulong uVar1;
  int iVar2;
  nn_timerset_hndl *item;
  uint64_t uVar3;
  int iVar4;
  
  iVar2 = nn_list_empty(&self->timeouts);
  iVar4 = -0xb;
  if (iVar2 == 0) {
    nn_list_begin(&self->timeouts);
    item = (nn_timerset_hndl *)nn_list_begin(&self->timeouts);
    uVar1 = item->timeout;
    uVar3 = nn_clock_ms();
    if (uVar1 <= uVar3) {
      nn_list_erase(&self->timeouts,(nn_list_item *)item);
      *hndl = item;
      iVar4 = 0;
    }
  }
  return iVar4;
}

Assistant:

int nn_timerset_event (struct nn_timerset *self, struct nn_timerset_hndl **hndl)
{
    struct nn_timerset_hndl *first;

    /*  If there's no timeout, there's no event to report. */
    if (nn_fast (nn_list_empty (&self->timeouts)))
        return -EAGAIN;

    /*  If no timeout have expired yet, there's no event to return. */
    first = nn_cont (nn_list_begin (&self->timeouts),
        struct nn_timerset_hndl, list);
    if (first->timeout > nn_clock_ms())
        return -EAGAIN;

    /*  Return the first timeout and remove it from the list of active
        timeouts. */
    nn_list_erase (&self->timeouts, &first->list);
    *hndl = first;
    return 0;
}